

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O2

int send_telemetry_with_device_client
              (BACK_COMPAT_HANDLE handle,DEVICE_CREATION_TYPE create_type,
              MESSAGE_CREATION_MECHANISM msg_type,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  _Bool _Var1;
  IOTHUB_CLIENT_RESULT IVar2;
  IOTHUBMESSAGE_CONTENT_TYPE IVar3;
  IOTHUB_MESSAGE_RESULT IVar4;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE iotHubClientHandle;
  LOGGER_LOG p_Var5;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  int iVar6;
  size_t timeout_seconds;
  char *pcVar7;
  bool bVar8;
  BACK_COMPAT_MSG_CTX bc_msg_ctx;
  uchar *buffer;
  size_t local_30;
  
  bc_msg_ctx.twin_callback_recv = false;
  bc_msg_ctx.callback_recv = false;
  bc_msg_ctx.connected = false;
  iotHubClientHandle = create_device_client(handle,create_type,protocol);
  if (iotHubClientHandle == (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return 0;
    }
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
              ,"send_telemetry_with_device_client",0x268,1,"Failure creating davice client");
    return 0;
  }
  IVar2 = IoTHubDeviceClient_LL_SetConnectionStatusCallback
                    (iotHubClientHandle,connection_status_callback,&bc_msg_ctx);
  if (IVar2 == IOTHUB_CLIENT_OK) {
    if (msg_type == TEST_MESSAGE_CREATE_STRING) {
      iotHubMessageHandle = IoTHubMessage_CreateFromString("back_compat_message_string");
LAB_0011b0f3:
      if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) goto LAB_0011b168;
      IVar3 = IoTHubMessage_GetContentType(iotHubMessageHandle);
      bVar8 = true;
      if (IVar3 == IOTHUBMESSAGE_STRING) {
        pcVar7 = IoTHubMessage_GetString(iotHubMessageHandle);
        if (pcVar7 == (char *)0x0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar7 = "Failure Getting string from iothub message";
            bVar8 = false;
            iVar6 = 0x20d;
            goto LAB_0011b1de;
          }
          bVar8 = false;
        }
      }
      else if (IVar3 == IOTHUBMESSAGE_BYTEARRAY) {
        IVar4 = IoTHubMessage_GetByteArray(iotHubMessageHandle,&buffer,&local_30);
        bVar8 = IVar4 == IOTHUB_MESSAGE_OK;
        if ((!bVar8) && (p_Var5 = xlogging_get_log_function(), p_Var5 != (LOGGER_LOG)0x0)) {
          pcVar7 = "Failure Getting byte array from iothub message";
          iVar6 = 0x204;
LAB_0011b1de:
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                    ,"send_telemetry_message",iVar6,1,pcVar7);
        }
      }
      IoTHubMessage_SetMessageId(iotHubMessageHandle,"MSG_ID");
      IoTHubMessage_GetMessageId(iotHubMessageHandle);
      IoTHubMessage_SetCorrelationId(iotHubMessageHandle,"CORE_ID");
      IoTHubMessage_GetCorrelationId(iotHubMessageHandle);
      IoTHubMessage_SetContentTypeSystemProperty(iotHubMessageHandle,"application%2fjson");
      IoTHubMessage_GetContentTypeSystemProperty(iotHubMessageHandle);
      IoTHubMessage_SetContentEncodingSystemProperty(iotHubMessageHandle,"utf-8");
      IoTHubMessage_GetContentEncodingSystemProperty(iotHubMessageHandle);
      IoTHubMessage_SetOutputName(iotHubMessageHandle,"output_name");
      IoTHubMessage_GetOutputName(iotHubMessageHandle);
      IoTHubMessage_SetInputName(iotHubMessageHandle,"input_name");
      IoTHubMessage_GetInputName(iotHubMessageHandle);
      IoTHubMessage_SetProperty(iotHubMessageHandle,"property_key","property_value");
      IoTHubMessage_GetProperty(iotHubMessageHandle,"property_key");
      IVar2 = IoTHubDeviceClient_LL_SendEventAsync
                        (iotHubClientHandle,iotHubMessageHandle,message_recv_callback,&bc_msg_ctx);
      if (IVar2 != IOTHUB_CLIENT_OK) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0011b2e2;
        pcVar7 = "Failure calling send event async";
        iVar6 = 0x22b;
        goto LAB_0011b2dd;
      }
      if (bVar8) {
        tickcounter_get_current_ms(handle->tick_cntr_handle,(tickcounter_ms_t *)&buffer);
        do {
          IoTHubDeviceClient_LL_DoWork(iotHubClientHandle);
          if (bc_msg_ctx.callback_recv != false) break;
          _Var1 = is_operation_timed_out
                            (handle->tick_cntr_handle,(tickcounter_ms_t)buffer,timeout_seconds);
        } while (!_Var1);
        goto LAB_0011b314;
      }
    }
    else {
      if (msg_type == TEST_MESSAGE_CREATE_BYTE_ARRAY) {
        iotHubMessageHandle = IoTHubMessage_CreateFromByteArray("\x03\v\f",3);
        goto LAB_0011b0f3;
      }
LAB_0011b168:
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar7 = "Failure creating Iothub message";
        iVar6 = 0x1f6;
LAB_0011b2dd:
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"send_telemetry_message",iVar6,1,pcVar7);
      }
    }
LAB_0011b2e2:
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0011b314;
    pcVar7 = "Failure sending telemetry message";
    iVar6 = 0x274;
  }
  else {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0011b314;
    pcVar7 = "Failure setting connection status callback";
    iVar6 = 0x26f;
  }
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
            ,"send_telemetry_with_device_client",iVar6,1,pcVar7);
LAB_0011b314:
  IoTHubDeviceClient_LL_Destroy(iotHubClientHandle);
  if (handle->transport_handle != (TRANSPORT_HANDLE)0x0) {
    IoTHubTransport_Destroy(handle->transport_handle);
  }
  return 0;
}

Assistant:

int send_telemetry_with_device_client(BACK_COMPAT_HANDLE handle, DEVICE_CREATION_TYPE create_type, MESSAGE_CREATION_MECHANISM msg_type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    int result;
    BACK_COMPAT_MSG_CTX bc_msg_ctx = { 0 };
    IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client = create_device_client(handle, create_type, protocol);
    if (device_client == NULL)
    {
        LogError("Failure creating davice client");
        result = __LINE__;
    }
    else
    {
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetConnectionStatusCallback(device_client, connection_status_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting connection status callback");
            result = __LINE__;
        }
        else if (send_telemetry_message(device_client, msg_type, &bc_msg_ctx) != 0)
        {
            LogError("Failure sending telemetry message");
            result = __LINE__;
        }
        else
        {
            tickcounter_ms_t start_time;
            (void)tickcounter_get_current_ms(handle->tick_cntr_handle, &start_time);
            result = 0;
            do
            {
                IoTHubDeviceClient_LL_DoWork(device_client);
            } while (!bc_msg_ctx.callback_recv && !is_operation_timed_out(handle->tick_cntr_handle, start_time, MAX_OPERATION_TIMEOUT));
        }
        IoTHubDeviceClient_LL_Destroy(device_client);
        if (handle->transport_handle != NULL)
        {
            IoTHubTransport_Destroy(handle->transport_handle);
        }
    }
    return 0;
}